

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaParseLocalAttributes
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr *child,
              xmlSchemaItemListPtr *list,int parentType,int *hasRefs)

{
  xmlHashTablePtr pxVar1;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlChar *refNs;
  int iVar3;
  int iVar4;
  _xmlDoc *node;
  xmlChar **ppxVar5;
  xmlNodePtr pxVar6;
  _xmlNs *p_Var7;
  xmlSchemaTypePtr pxVar8;
  xmlSchemaAttributePtr pxVar9;
  _xmlNode **pp_Var10;
  _xmlSchemaType *p_Var11;
  xmlAttrPtr pxVar12;
  xmlSchemaAttributePtr_conflict pxVar13;
  ulong uVar14;
  xmlSchemaTypePtr pxVar15;
  uint uVar16;
  xmlNodePtr pxVar17;
  char *type;
  ulong uVar18;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr pxVar19;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlDictPtr *ppxVar20;
  xmlParserErrors error;
  undefined4 in_register_00000084;
  char *uri;
  char *local;
  _xmlSchemaType *schema_00;
  char *in_stack_ffffffffffffff48;
  xmlChar *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  xmlChar *tmpNs;
  int local_8c;
  xmlChar *tmpName;
  int local_7c;
  xmlChar *name;
  _xmlSchemaType *local_70;
  _xmlNode *local_68;
  _xmlDoc *local_60;
  _xmlDoc *local_58;
  _xmlNode *local_50;
  xmlAttributeType local_48;
  int local_44;
  xmlSchemaTypePtr local_40;
  _xmlDoc *local_38;
  
  uri = (char *)CONCAT44(in_register_00000084,parentType);
  pxVar17 = *child;
  local = (char *)hasRefs;
  local_60 = (_xmlDoc *)schema;
  local_50 = (_xmlNode *)list;
  local_44 = parentType;
  local_38 = (_xmlDoc *)hasRefs;
  do {
    if (pxVar17 == (xmlNodePtr)0x0) {
      return 0;
    }
    if (pxVar17->ns == (xmlNs *)0x0) {
LAB_0019057f:
      if (pxVar17->ns == (xmlNs *)0x0) {
        return 0;
      }
      iVar3 = xmlStrEqual(pxVar17->name,(xmlChar *)"attributeGroup");
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = xmlStrEqual((*child)->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar3 == 0) {
        return 0;
      }
    }
    else {
      iVar3 = xmlStrEqual(pxVar17->name,"attribute");
      pxVar17 = *child;
      if (iVar3 == 0) {
LAB_00190576:
        if (pxVar17 == (xmlNodePtr)0x0) {
          return 0;
        }
        goto LAB_0019057f;
      }
      iVar3 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar3 == 0) {
        pxVar17 = *child;
        goto LAB_00190576;
      }
    }
    schema_00 = (_xmlSchemaType *)*child;
    if (schema_00 == (_xmlSchemaType *)0x0) goto LAB_0019128d;
    if (schema_00->node == (xmlNodePtr)0x0) {
LAB_0019099f:
      name = (xmlChar *)0x0;
      tmpNs = (xmlChar *)0x0;
      pxVar6 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"ref");
      if (pxVar6 == (xmlNodePtr)0x0) {
        xmlSchemaPMissingAttrErr
                  (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1d1911,pxVar17,uri,local
                  );
      }
      else {
        uri = (char *)&tmpNs;
        xmlSchemaPValAttrNodeQName
                  (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)pxVar6,(xmlAttrPtr)&name,
                   (xmlChar **)uri,(xmlChar **)local);
        refNs = name;
        pxVar12 = (xmlAttrPtr)name;
        iVar3 = xmlSchemaCheckReference
                          (ctxt,(xmlSchemaPtr)schema_00,pxVar6,(xmlAttrPtr)name,(xmlChar *)uri);
        if (iVar3 == 0) {
          ppxVar20 = (xmlDictPtr *)&schema_00->flags;
          pxVar19 = extraout_RDX_01;
          while (pxVar1 = (xmlHashTablePtr)*ppxVar20, pxVar1 != (xmlHashTablePtr)0x0) {
            if (*(long *)&pxVar1[2].size == 0) {
              iVar3 = xmlStrEqual((xmlChar *)pxVar1->dict,"ref");
              pxVar19 = extraout_RDX_04;
              if ((iVar3 == 0) &&
                 (iVar3 = xmlStrEqual((xmlChar *)pxVar1->dict,"id"), pxVar19 = extraout_RDX_05,
                 iVar3 == 0)) goto LAB_00190a29;
            }
            else {
              iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)&pxVar1[2].size + 0x10),
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar19 = extraout_RDX_02;
              if (iVar3 != 0) {
LAB_00190a29:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar1,pxVar19,pxVar12);
                pxVar19 = extraout_RDX_03;
              }
            }
            ppxVar20 = &pxVar1[1].dict;
          }
          xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,(xmlChar *)pxVar19);
          pxVar17 = (xmlNodePtr)schema_00->id;
          if (pxVar17 != (xmlNodePtr)0x0) {
            if (((pxVar17->ns != (xmlNs *)0x0) &&
                (iVar3 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
               (iVar3 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 != 0)) {
              xmlSchemaParseAnnotation(ctxt,pxVar17,0);
              pxVar17 = pxVar17->next;
              if (pxVar17 == (_xmlNode *)0x0) goto LAB_00190af8;
            }
            uri = (char *)0x0;
            local = "(annotation?)";
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)schema_00,
                       pxVar17,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff48);
          }
LAB_00190af8:
          if (((ctxt->isRedefine == 0) ||
              (pxVar2 = ctxt->redef, pxVar2 == (xmlSchemaRedefPtr_conflict)0x0)) ||
             ((pxVar2->item->type != XML_SCHEMA_TYPE_ATTRIBUTEGROUP ||
              ((tmpNs != pxVar2->refName || (refNs != pxVar2->refTargetNs)))))) {
            pxVar8 = (xmlSchemaTypePtr)
                     xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,tmpNs,refNs);
            if (pxVar8 != (xmlSchemaTypePtr)0x0) {
              pxVar8->refNs = (xmlChar *)schema_00;
              iVar3 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar8);
              if (iVar3 < 0) {
                xmlSchemaPErrMemory(ctxt);
              }
LAB_00190b78:
              if (local_38 != (_xmlDoc *)0x0) {
                *(int *)&local_38->_private = 1;
              }
              goto LAB_00190b8b;
            }
          }
          else if (ctxt->redefCounter == 0) {
            ctxt->redefCounter = 1;
            pxVar8 = (xmlSchemaTypePtr)
                     xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,tmpNs,refNs);
            if (pxVar8 != (xmlSchemaTypePtr)0x0) {
              pxVar8->refNs = (xmlChar *)schema_00;
              ctxt->redef->reference = (xmlSchemaBasicItemPtr)pxVar8;
              goto LAB_00190b78;
            }
          }
          else {
            tmpName = (xmlChar *)0x0;
            local = (char *)xmlSchemaFormatQName(&tmpName,refNs,tmpNs);
            in_stack_ffffffffffffff48 = (char *)0x0;
            uri = 
            "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
            ;
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,
                               (xmlNodePtr)schema_00,(xmlSchemaBasicItemPtr)0x0,
                               "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
                               ,(xmlChar *)local,(xmlChar *)0x0);
            pxVar8 = (xmlSchemaTypePtr)tmpName;
joined_r0x00191282:
            if (pxVar8 != (xmlSchemaTypePtr)0x0) {
LAB_00191284:
              (*xmlFree)(pxVar8);
            }
          }
        }
      }
    }
    else {
      iVar3 = xmlStrEqual(schema_00->name,"attribute");
      schema_00 = (_xmlSchemaType *)*child;
      if (iVar3 == 0) {
LAB_0019097d:
        name = (xmlChar *)0x0;
        tmpNs = (xmlChar *)0x0;
        if (schema_00 != (_xmlSchemaType *)0x0) goto LAB_0019099f;
      }
      else {
        iVar3 = xmlStrEqual((xmlChar *)schema_00->node->name,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema");
        schema_00 = (_xmlSchemaType *)*child;
        if (iVar3 == 0) goto LAB_0019097d;
        p_Var7 = (_xmlNs *)local_50->_private;
        name = (xmlChar *)0x0;
        tmpNs = (xmlChar *)0x0;
        tmpName = (xmlChar *)0x0;
        if (schema_00 == (_xmlSchemaType *)0x0) goto LAB_0019128d;
        node = (_xmlDoc *)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"ref");
        if (node != (_xmlDoc *)0x0) {
          uri = (char *)&tmpName;
          iVar3 = xmlSchemaPValAttrNodeQName
                            (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)node,
                             (xmlAttrPtr)&tmpNs,(xmlChar **)uri,(xmlChar **)local);
          if ((iVar3 != 0) ||
             (pxVar17 = (xmlNodePtr)tmpNs,
             iVar3 = xmlSchemaCheckReference
                               (ctxt,(xmlSchemaPtr)schema_00,(xmlNodePtr)node,(xmlAttrPtr)tmpNs,
                                (xmlChar *)uri), iVar3 != 0)) goto LAB_0019128d;
        }
        local_48 = ctxt->nberrors;
        local_70 = (_xmlSchemaType *)0x0;
        iVar3 = 2;
        local_7c = 0;
        local_8c = 0;
        local_68 = (_xmlNode *)0x0;
        pp_Var10 = (_xmlNode **)&schema_00->flags;
        local_58 = node;
        while (pxVar6 = *pp_Var10, pxVar6 != (xmlNodePtr)0x0) {
          if (pxVar6->ns == (xmlNs *)0x0) {
            if (local_58 == (_xmlDoc *)0x0) {
              iVar4 = xmlStrEqual(pxVar6->name,"name");
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(pxVar6->name,"id");
                if (iVar4 != 0) goto LAB_0019071d;
                iVar4 = xmlStrEqual(pxVar6->name,"type");
                if (iVar4 == 0) {
                  iVar4 = xmlStrEqual(pxVar6->name,"form");
                  if (iVar4 == 0) goto LAB_001907a0;
                  ppxVar5 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,pxVar6);
                  iVar4 = xmlStrEqual((xmlChar *)ppxVar5,"qualified");
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual((xmlChar *)ppxVar5,(xmlChar *)"unqualified");
                    if (iVar4 == 0) {
                      in_stack_ffffffffffffff48 = (char *)0x0;
                      in_stack_ffffffffffffff50 = (xmlChar *)0x0;
                      pxVar17 = (xmlNodePtr)0x0;
                      uri = "(qualified | unqualified)";
                      xmlSchemaPSimpleTypeErr
                                (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                                 (xmlSchemaBasicItemPtr)pxVar6,(xmlNodePtr)0x0,
                                 (xmlSchemaTypePtr)"(qualified | unqualified)",(char *)ppxVar5,
                                 (xmlChar *)0x0,(char *)0x0,(xmlChar *)p_Var7,
                                 (xmlChar *)CONCAT44(iVar3,in_stack_ffffffffffffff60));
                      local = (char *)ppxVar5;
                    }
                  }
                  else {
                    local_68 = (_xmlNode *)ctxt->targetNamespace;
                  }
                  local_7c = 1;
                }
                else {
                  pxVar17 = (xmlNodePtr)&tmpNs;
                  uri = (char *)&tmpName;
                  xmlSchemaPValAttrNodeQName
                            (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)pxVar6,
                             (xmlAttrPtr)pxVar17,(xmlChar **)uri,(xmlChar **)local);
                }
              }
            }
            else {
              iVar4 = xmlStrEqual(pxVar6->name,"id");
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(pxVar6->name,"ref");
                if (iVar4 == 0) {
LAB_001907a0:
                  iVar4 = xmlStrEqual(pxVar6->name,"use");
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual(pxVar6->name,"default");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(pxVar6->name,(xmlChar *)"fixed");
                      pxVar19 = extraout_RDX_00;
                      if (iVar4 == 0) goto LAB_001906f1;
                      if (local_70 != (_xmlSchemaType *)0x0) goto LAB_001908b0;
                      local_70 = (_xmlSchemaType *)xmlSchemaGetNodeContent(ctxt,pxVar6);
                      local_8c = 2;
                    }
                    else if (local_70 == (_xmlSchemaType *)0x0) {
                      local_70 = (_xmlSchemaType *)xmlSchemaGetNodeContent(ctxt,pxVar6);
                      local_8c = 1;
                    }
                    else {
LAB_001908b0:
                      uri = "default";
                      local = "fixed";
                      pxVar17 = pxVar6;
                      xmlSchemaPMutualExclAttrErr
                                (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,(xmlSchemaBasicItemPtr)0x0,
                                 (xmlAttrPtr)pxVar6,"default","fixed");
                    }
                  }
                  else {
                    ppxVar5 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,pxVar6);
                    iVar4 = xmlStrEqual((xmlChar *)ppxVar5,(xmlChar *)"optional");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual((xmlChar *)ppxVar5,(xmlChar *)"prohibited");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual((xmlChar *)ppxVar5,"required");
                        if (iVar4 == 0) {
                          in_stack_ffffffffffffff48 = (char *)0x0;
                          in_stack_ffffffffffffff50 = (xmlChar *)0x0;
                          pxVar17 = (xmlNodePtr)0x0;
                          uri = "(optional | prohibited | required)";
                          xmlSchemaPSimpleTypeErr
                                    (ctxt,XML_SCHEMAP_INVALID_ATTR_USE,(xmlSchemaBasicItemPtr)pxVar6
                                     ,(xmlNodePtr)0x0,
                                     (xmlSchemaTypePtr)"(optional | prohibited | required)",
                                     (char *)ppxVar5,(xmlChar *)0x0,(char *)0x0,(xmlChar *)p_Var7,
                                     (xmlChar *)CONCAT44(iVar3,in_stack_ffffffffffffff60));
                          local = (char *)ppxVar5;
                        }
                        else {
                          iVar3 = 1;
                        }
                      }
                      else {
                        iVar3 = 0;
                      }
                    }
                    else {
                      iVar3 = 2;
                    }
                  }
                }
              }
              else {
LAB_0019071d:
                xmlSchemaPValAttrNodeID(ctxt,(xmlAttrPtr)pxVar6);
              }
            }
          }
          else {
            iVar4 = xmlStrEqual(pxVar6->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            pxVar19 = extraout_RDX;
            if (iVar4 != 0) {
LAB_001906f1:
              xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar6,pxVar19,(xmlAttrPtr)pxVar17);
            }
          }
          pp_Var10 = &pxVar6->next;
        }
        pxVar17 = (xmlNodePtr)CONCAT71((int7)((ulong)pxVar17 >> 8),iVar3 != 2 && local_8c == 1);
        if (iVar3 != 2 && local_8c == 1) {
          in_stack_ffffffffffffff50 = (xmlChar *)0x0;
          in_stack_ffffffffffffff48 =
               "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
          ;
          pxVar17 = (xmlNodePtr)0x0;
          uri = "(optional | prohibited | required)";
          local = (char *)0x0;
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_2,(xmlSchemaBasicItemPtr)schema_00,
                     (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(optional | prohibited | required)",
                     (char *)0x0,
                     (xmlChar *)
                     "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
                     ,(char *)0x0,(xmlChar *)p_Var7,
                     (xmlChar *)CONCAT44(iVar3,in_stack_ffffffffffffff60));
        }
        if (local_48 != ctxt->nberrors) goto LAB_0019128d;
        if (local_58 == (_xmlDoc *)0x0) {
          if ((local_7c == 0) && (((ulong)local_60->next & 2) != 0)) {
            local_68 = (_xmlNode *)ctxt->targetNamespace;
          }
          iVar4 = xmlStrEqual((xmlChar *)local_68,
                              (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
          if (iVar4 != 0) {
            in_stack_ffffffffffffff48 = (char *)0x0;
            pxVar17 = (xmlNodePtr)0x0;
            uri = "The target namespace must not match \'%s\'";
            local = "http://www.w3.org/2001/XMLSchema-instance";
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_NO_XSI,
                               (xmlNodePtr)schema_00,(xmlSchemaBasicItemPtr)0x0,
                               "The target namespace must not match \'%s\'",
                               (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",(xmlChar *)0x0
                              );
          }
          pxVar12 = xmlSchemaGetPropNode((xmlNodePtr)schema_00,"name");
          if (pxVar12 == (xmlAttrPtr)0x0) {
            xmlSchemaPMissingAttrErr
                      (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1bc044,pxVar17,uri,
                       local);
          }
          else {
            pxVar8 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
            iVar4 = xmlSchemaPValAttrNode
                              (ctxt,(xmlSchemaBasicItemPtr)pxVar12,(xmlAttrPtr)pxVar8,
                               (xmlSchemaTypePtr)&name,(xmlChar **)uri);
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(name,"xmlns");
              if (iVar4 == 0) {
                if (iVar3 == 0) goto LAB_00191052;
                pxVar8 = (xmlSchemaTypePtr)xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)schema_00);
                if (pxVar8 != (xmlSchemaTypePtr)0x0) {
                  *(int *)&pxVar8->annot = iVar3;
                  uri = (char *)0x0;
                  pxVar13 = xmlSchemaAddAttribute
                                      (ctxt,(xmlSchemaPtr)name,(xmlChar *)local_68,
                                       (xmlChar *)schema_00,(xmlNodePtr)0x0,(int)local);
                  if (pxVar13 != (xmlSchemaAttributePtr_conflict)0x0) {
                    if (tmpName != (xmlChar *)0x0) {
                      pxVar13->typeName = tmpName;
                      pxVar13->typeNs = tmpNs;
                    }
                    pxVar8->id = (xmlChar *)pxVar13;
                    if ((local_70 != (_xmlSchemaType *)0x0) &&
                       (pxVar13->defValue = (xmlChar *)local_70, local_8c == 2)) {
                      pp_Var10 = (_xmlNode **)&pxVar13->flags;
                      uVar16 = 0x200;
                      goto LAB_00190cb4;
                    }
                    goto LAB_00190cb6;
                  }
                }
              }
              else {
                pxVar8 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                in_stack_ffffffffffffff50 = (xmlChar *)0x0;
                in_stack_ffffffffffffff48 = "The value of the attribute must not match \'xmlns\'";
                uri = (char *)0x0;
                local = (char *)0x0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar12,
                           (xmlNodePtr)pxVar8,(xmlSchemaTypePtr)0x0,(char *)0x0,
                           (xmlChar *)"The value of the attribute must not match \'xmlns\'",
                           (char *)0x0,(xmlChar *)p_Var7,
                           (xmlChar *)CONCAT44(iVar3,in_stack_ffffffffffffff60));
              }
            }
          }
          goto LAB_0019128d;
        }
        if (iVar3 == 0) {
LAB_00191052:
          uri = (char *)p_Var7;
          pxVar17 = (xmlNodePtr)schema_00->id;
          if (pxVar17 != (xmlNodePtr)0x0) {
            if (((pxVar17->ns != (xmlNs *)0x0) &&
                (iVar3 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
               (iVar3 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 != 0)) {
              xmlSchemaParseAnnotation(ctxt,pxVar17,0);
              pxVar17 = pxVar17->next;
              if (pxVar17 == (_xmlNode *)0x0) goto LAB_001910c2;
            }
            local = "(annotation?)";
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)schema_00,
                       pxVar17,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff48);
          }
LAB_001910c2:
          if (local_44 == 0xd) {
            type = "Skipping attribute use prohibition, since it is pointless when extending a type"
            ;
LAB_00191105:
            in_stack_ffffffffffffff48 = (char *)0x0;
            uri = (char *)0x0;
            local = (char *)0x0;
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                       (xmlNodePtr)schema_00,(xmlSchemaTypePtr)type,(char *)0x0,(xmlChar *)0x0,
                       (xmlChar *)0x0,in_stack_ffffffffffffff50);
            goto LAB_0019128d;
          }
          if (local_44 == 0x10) {
            type = 
            "Skipping attribute use prohibition, since it is pointless inside an <attributeGroup>";
            goto LAB_00191105;
          }
          if (local_58 == (_xmlDoc *)0x0) {
            tmpName = name;
            tmpNs = (xmlChar *)local_68;
          }
          if ((_xmlNs *)uri != (_xmlNs *)0x0) {
            uVar14 = (ulong)((_xmlNs *)uri)->type;
            if ((int)((_xmlNs *)uri)->type < 1) {
              uVar14 = 0;
            }
            for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
              p_Var7 = (&((_xmlNs *)uri)->next->next)[uVar18];
              if (((*(int *)&p_Var7->next == 0x7d1) && (tmpName == p_Var7->href)) &&
                 (tmpNs == p_Var7->prefix)) {
                local_40 = (xmlSchemaTypePtr)0x0;
                uri = (char *)xmlSchemaFormatQName((xmlChar **)&local_40,tmpNs,tmpName);
                in_stack_ffffffffffffff48 = (char *)0x0;
                local = (char *)0x0;
                xmlSchemaCustomWarning
                          ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                           (xmlNodePtr)schema_00,
                           (xmlSchemaTypePtr)"Skipping duplicate attribute use prohibition \'%s\'",
                           uri,(xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff50);
                pxVar8 = local_40;
                goto joined_r0x00191282;
              }
            }
          }
          pxVar8 = (xmlSchemaTypePtr)(*xmlMalloc)(0x28);
          if (pxVar8 == (xmlSchemaTypePtr)0x0) {
            xmlSchemaPErrMemory(ctxt);
            goto LAB_0019128d;
          }
          *(undefined8 *)pxVar8 = 0;
          pxVar8->next = (_xmlSchemaType *)0x0;
          pxVar8->name = (xmlChar *)0x0;
          pxVar8->id = (xmlChar *)0x0;
          pxVar8->ref = (xmlChar *)0x0;
          pxVar8->type = XML_SCHEMA_EXTRA_ATTR_USE_PROHIB;
          iVar3 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,pxVar8);
          if (-1 < iVar3) {
            pxVar8->next = schema_00;
            pxVar8->name = tmpName;
            pxVar8->id = tmpNs;
            if ((local_58 != (_xmlDoc *)0x0) &&
               (iVar3 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar8), iVar3 < 0)) {
              xmlSchemaPErrMemory(ctxt);
            }
            goto LAB_00190b8b;
          }
          xmlSchemaPErrMemory(ctxt);
          goto LAB_00191284;
        }
        pxVar8 = (xmlSchemaTypePtr)xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)schema_00);
        if (pxVar8 == (xmlSchemaTypePtr)0x0) goto LAB_0019128d;
        iVar4 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar8);
        if (iVar4 < 0) {
          xmlSchemaPErrMemory(ctxt);
        }
        *(int *)&pxVar8->annot = iVar3;
        pxVar9 = (xmlSchemaAttributePtr)
                 xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_ATTRIBUTE,tmpName,tmpNs);
        if (pxVar9 == (xmlSchemaAttributePtr)0x0) goto LAB_0019128d;
        pxVar8->id = (xmlChar *)pxVar9;
        if (local_70 != (_xmlSchemaType *)0x0) {
          pxVar8->subtypes = local_70;
        }
        if (local_8c == 2) {
          pp_Var10 = (_xmlNode **)&pxVar8->ref;
          uVar16 = 1;
LAB_00190cb4:
          *(uint *)pp_Var10 = *(uint *)pp_Var10 | uVar16;
        }
LAB_00190cb6:
        pxVar17 = (xmlNodePtr)schema_00->id;
        if (pxVar17 != (xmlNodePtr)0x0) {
          if (((pxVar17->ns != (xmlNs *)0x0) &&
              (iVar3 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
             (iVar3 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar3 != 0)) {
            p_Var11 = (_xmlSchemaType *)xmlSchemaParseAnnotation(ctxt,pxVar17,1);
            pxVar8->next = p_Var11;
            pxVar17 = pxVar17->next;
          }
          if (local_58 == (_xmlDoc *)0x0) {
            if (pxVar17 != (xmlNodePtr)0x0) {
              if (((pxVar17->ns != (xmlNs *)0x0) &&
                  (iVar3 = xmlStrEqual(pxVar17->name,"simpleType"), iVar3 != 0)) &&
                 (iVar3 = xmlStrEqual(pxVar17->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar3 != 0)) {
                if (((xmlSchemaAttributePtr)pxVar8->id)->typeName == (xmlChar *)0x0) {
                  pxVar15 = xmlSchemaParseSimpleType(ctxt,(xmlSchemaPtr)local_60,pxVar17,0);
                  ((xmlSchemaAttributePtr)pxVar8->id)->subtypes = pxVar15;
                }
                else {
                  uri = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                  local = (char *)0x0;
                  xmlSchemaPContentErr
                            (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,(xmlSchemaBasicItemPtr)schema_00,
                             pxVar17,(xmlNodePtr)
                                     "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                             ,(char *)0x0,in_stack_ffffffffffffff48);
                }
                pxVar17 = pxVar17->next;
                if (pxVar17 == (xmlNodePtr)0x0) goto LAB_00190b8b;
              }
              error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
              local = "(annotation?, simpleType?)";
              goto LAB_001912df;
            }
          }
          else if (pxVar17 != (xmlNodePtr)0x0) {
            if (((pxVar17->ns == (xmlNs *)0x0) ||
                (iVar3 = xmlStrEqual(pxVar17->name,"simpleType"), iVar3 == 0)) ||
               (iVar3 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 == 0)) {
              error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
            }
            else {
              error = XML_SCHEMAP_SRC_ATTRIBUTE_3_2;
            }
            local = "(annotation?)";
LAB_001912df:
            uri = (char *)0x0;
            xmlSchemaPContentErr
                      (ctxt,error,(xmlSchemaBasicItemPtr)schema_00,pxVar17,(xmlNodePtr)0x0,local,
                       in_stack_ffffffffffffff48);
          }
        }
LAB_00190b8b:
        p_Var7 = (_xmlNs *)local_50->_private;
        if (p_Var7 == (_xmlNs *)0x0) {
          p_Var7 = (_xmlNs *)xmlSchemaItemListCreate();
          local_50->_private = p_Var7;
          if (p_Var7 == (_xmlNs *)0x0) {
            return -1;
          }
        }
        iVar3 = xmlSchemaItemListAddSize((xmlSchemaItemListPtr)p_Var7,2,pxVar8);
        if (iVar3 == -1) {
          return -1;
        }
      }
    }
LAB_0019128d:
    pxVar17 = (*child)->next;
    *child = pxVar17;
  } while( true );
}

Assistant:

static int
xmlSchemaParseLocalAttributes(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr *child, xmlSchemaItemListPtr *list,
			int parentType, int *hasRefs)
{
    void *item;

    while ((IS_SCHEMA((*child), "attribute")) ||
           (IS_SCHEMA((*child), "attributeGroup"))) {
        if (IS_SCHEMA((*child), "attribute")) {
	    item = xmlSchemaParseLocalAttribute(ctxt, schema, *child,
		*list, parentType);
        } else {
            item = xmlSchemaParseAttributeGroupRef(ctxt, schema, *child);
	    if ((item != NULL) && (hasRefs != NULL))
		*hasRefs = 1;
        }
	if (item != NULL) {
	    if (*list == NULL) {
		/* TODO: Customize grow factor. */
		*list = xmlSchemaItemListCreate();
		if (*list == NULL)
		    return(-1);
	    }
	    if (xmlSchemaItemListAddSize(*list, 2, item) == -1)
		return(-1);
	}
        *child = (*child)->next;
    }
    return (0);
}